

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

double __thiscall
NEST::LArNEST::GetLETRecombinationProbability(LArNEST *this,double LET,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = 0.0;
  if (this->fUseDokeBirks == true) {
    dVar1 = pow(efield / 1000.0,-0.85);
    dVar1 = dVar1 * 0.07;
    if ((efield == 0.0) && (!NAN(efield))) {
      dVar1 = 0.0003;
    }
    dVar3 = 0.0;
    if ((efield == 0.0) && (!NAN(efield))) {
      dVar3 = 0.75;
    }
    dVar3 = (dVar1 * LET) / ((dVar1 / (1.0 - dVar3)) * LET + 1.0) + dVar3;
    dVar2 = 0.0;
    if (0.0 <= dVar3) {
      dVar2 = dVar3;
    }
    dVar1 = 1.0;
    if (dVar2 <= 1.0) {
      dVar1 = dVar2;
    }
  }
  return dVar1;
}

Assistant:

double LArNEST::GetLETRecombinationProbability(double LET, double efield) {
  if (fUseDokeBirks) {
    // set up DokeBirks coefficients
    double DokeBirksA = 0.07 * pow((efield / 1.0e3), -0.85);
    double DokeBirksC = 0.00;
    if (efield == 0.0) {
      DokeBirksA = 0.0003;
      DokeBirksC = 0.75;
    }
    // B=A/(1-C) (see paper)
    double DokeBirksB = DokeBirksA / (1 - DokeBirksC);
    double recombProb =
        (DokeBirksA * LET) / (1 + DokeBirksB * LET) + DokeBirksC;

    // check against unphysicality resulting from rounding errors
    if (recombProb < 0.0) {
      recombProb = 0.0;
    }
    if (recombProb > 1.0) {
      recombProb = 1.0;
    }
    return recombProb;
  } else {
    return 0;
  }
}